

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# constraints.c
# Opt level: O3

int asn_check_constraints
              (asn_TYPE_descriptor_t *type_descriptor,void *struct_ptr,char *errbuf,size_t *errlen)

{
  int iVar1;
  undefined8 local_38;
  undefined8 uStack_30;
  char *local_28;
  size_t local_20;
  
  local_38 = 0;
  uStack_30 = 0;
  if (errlen == (size_t *)0x0) {
    local_20 = 0;
  }
  else {
    local_20 = *errlen;
  }
  local_28 = errbuf;
  iVar1 = (*type_descriptor->check_constraints)
                    (type_descriptor,struct_ptr,_asn_i_ctfailcb,&local_38);
  if (iVar1 == -1 && errlen != (size_t *)0x0) {
    *errlen = local_20;
  }
  return iVar1;
}

Assistant:

int
asn_check_constraints(asn_TYPE_descriptor_t *type_descriptor,
		const void *struct_ptr, char *errbuf, size_t *errlen) {
	struct errbufDesc arg;
	int ret;

	arg.failed_type = 0;
	arg.failed_struct_ptr = 0;
	arg.errbuf = errbuf;
	arg.errlen = errlen ? *errlen : 0;

	ret = type_descriptor->check_constraints(type_descriptor,
		struct_ptr, _asn_i_ctfailcb, &arg);
	if(ret == -1 && errlen)
		*errlen = arg.errlen;

	return ret;
}